

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O1

size_t bita_ffirst(uint8_t *b,size_t tot,size_t bits)

{
  ulong uVar1;
  long lVar2;
  
  while( true ) {
    if (tot <= bits) {
      return 0xffffffffffffffff;
    }
    uVar1 = *(ulong *)b;
    if (uVar1 != 0) break;
    b = (uint8_t *)((long)b + 8);
    bits = bits + 0x40;
  }
  lVar2 = 0;
  if (uVar1 != 0) {
    for (; (uVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
    }
  }
  return lVar2 + bits;
}

Assistant:

static size_t bita_ffirst(const uint8_t *b, const size_t tot, size_t bits)
{
    if (bits >= tot)
        return SIZE_MAX;

    uint64_t w = *((uint64_t *) b);
    /* __builtin_ffsll returns one plus the index of the least significant 1-bit, or zero if not found */
    uint32_t r = __builtin_ffsll(w);
    if (r)
        return bits + r - 1; /* adjust result */

    return bita_ffirst(&b[8], tot, bits + 64);
}